

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O1

void __thiscall SDIOAnalyzer::~SDIOAnalyzer(SDIOAnalyzer *this)

{
  SDIOAnalyzerResults *pSVar1;
  SDIOAnalyzerSettings *pSVar2;
  
  *(undefined ***)this = &PTR__SDIOAnalyzer_0010bca0;
  Analyzer::KillThread();
  std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::~unique_ptr(&this->frameV2);
  SDIOSimulationDataGenerator::~SDIOSimulationDataGenerator(&this->mSimulationDataGenerator);
  pSVar1 = (this->mResults)._M_t.
           super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>.
           _M_t.
           super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>.
           super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl;
  if (pSVar1 != (SDIOAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  (this->mResults)._M_t.
  super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>._M_t.
  super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>.
  super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl = (SDIOAnalyzerResults *)0x0;
  pSVar2 = (this->mSettings)._M_t.
           super___uniq_ptr_impl<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>.
           _M_t.
           super__Tuple_impl<0UL,_SDIOAnalyzerSettings_*,_std::default_delete<SDIOAnalyzerSettings>_>
           .super__Head_base<0UL,_SDIOAnalyzerSettings_*,_false>._M_head_impl;
  if (pSVar2 != (SDIOAnalyzerSettings *)0x0) {
    (**(code **)(*(long *)pSVar2 + 8))();
  }
  (this->mSettings)._M_t.
  super___uniq_ptr_impl<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>._M_t.
  super__Tuple_impl<0UL,_SDIOAnalyzerSettings_*,_std::default_delete<SDIOAnalyzerSettings>_>.
  super__Head_base<0UL,_SDIOAnalyzerSettings_*,_false>._M_head_impl = (SDIOAnalyzerSettings *)0x0;
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SDIOAnalyzer::~SDIOAnalyzer()
{
    KillThread();
}